

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateDeprecatedConstructors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name)

{
  int iVar1;
  char *__s;
  size_type __len2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (name,"VkAllocationCallbacks");
  if (iVar1 == 0) {
    __len2 = 0x65c;
    __s = 
    "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    AllocationCallbacks( void *                               pUserData_,\n                         PFN_vkAllocationFunction             pfnAllocation_,\n                         PFN_vkReallocationFunction           pfnReallocation_       = {},\n                         PFN_vkFreeFunction                   pfnFree_               = {},\n                         PFN_vkInternalAllocationNotification pfnInternalAllocation_ = {},\n                         PFN_vkInternalFreeNotification       pfnInternalFree_       = {} ) VULKAN_HPP_NOEXCEPT\n      : AllocationCallbacks( pUserData_,\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_AllocationFunction>( pfnAllocation_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_ReallocationFunction>( pfnReallocation_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_FreeFunction>( pfnFree_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalAllocationNotification>( pfnInternalAllocation_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalFreeNotification>( pfnInternalFree_ ) )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
    ;
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (name,"VkDebugReportCallbackCreateInfoEXT");
    if (iVar1 == 0) {
      __len2 = 0x40b;
      __s = 
      "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DebugReportCallbackCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugReportFlagsEXT flags_,\n                                      PFN_vkDebugReportCallbackEXT              pfnCallback_,\n                                      void *                                    pUserData_   = {},\n                                      const void *                              pNext_       = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DebugReportCallbackCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugReportCallbackEXT>( pfnCallback_ ), pUserData_, pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
      ;
    }
    else {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(name,"VkDebugUtilsMessengerCreateInfoEXT");
      if (iVar1 == 0) {
        __len2 = 0x54d;
        __s = 
        "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DebugUtilsMessengerCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugUtilsMessengerCreateFlagsEXT flags_,\n                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageSeverityFlagsEXT messageSeverity_,\n                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageTypeFlagsEXT     messageType_,\n                                      PFN_vkDebugUtilsMessengerCallbackEXT                    pfnUserCallback_,\n                                      void *                                                  pUserData_       = {},\n                                      const void *                                            pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DebugUtilsMessengerCreateInfoEXT( flags_, messageSeverity_, messageType_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugUtilsMessengerCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
        ;
      }
      else {
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(name,"VkDeviceDeviceMemoryReportCreateInfoEXT");
        if (iVar1 == 0) {
          __len2 = 0x44d;
          __s = 
          "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DeviceDeviceMemoryReportCreateInfoEXT( VULKAN_HPP_NAMESPACE::DeviceMemoryReportFlagsEXT flags_,\n                                           PFN_vkDeviceMemoryReportCallbackEXT              pfnUserCallback_,\n                                           void *                                           pUserData_       = {},\n                                           const void *                                     pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DeviceDeviceMemoryReportCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DeviceMemoryReportCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
          ;
        }
        else {
          iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(name,"DirectDriverLoadingInfoLUNARG");
          if (iVar1 != 0) {
            return __return_storage_ptr__;
          }
          __len2 = 0x3c4;
          __s = 
          "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DirectDriverLoadingInfoLUNARG( VULKAN_HPP_NAMESPACE::DirectDriverLoadingFlagsLUNARG flags_,\n                                   PFN_vkGetInstanceProcAddrLUNARG                      pfnGetInstanceProcAddr_,\n                                   void *                                               pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DirectDriverLoadingInfoLUNARG( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_GetInstanceProcAddrLUNARG>( pfnGetInstanceProcAddr_ ), pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
          ;
        }
      }
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,__s,__len2);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateDeprecatedConstructors( std::string const & name ) const
{
  std::string str;
  if ( name == "VkAllocationCallbacks" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    AllocationCallbacks( void *                               pUserData_,
                         PFN_vkAllocationFunction             pfnAllocation_,
                         PFN_vkReallocationFunction           pfnReallocation_       = {},
                         PFN_vkFreeFunction                   pfnFree_               = {},
                         PFN_vkInternalAllocationNotification pfnInternalAllocation_ = {},
                         PFN_vkInternalFreeNotification       pfnInternalFree_       = {} ) VULKAN_HPP_NOEXCEPT
      : AllocationCallbacks( pUserData_,
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_AllocationFunction>( pfnAllocation_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_ReallocationFunction>( pfnReallocation_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_FreeFunction>( pfnFree_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalAllocationNotification>( pfnInternalAllocation_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalFreeNotification>( pfnInternalFree_ ) )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "VkDebugReportCallbackCreateInfoEXT" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DebugReportCallbackCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugReportFlagsEXT flags_,
                                      PFN_vkDebugReportCallbackEXT              pfnCallback_,
                                      void *                                    pUserData_   = {},
                                      const void *                              pNext_       = nullptr ) VULKAN_HPP_NOEXCEPT
      : DebugReportCallbackCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugReportCallbackEXT>( pfnCallback_ ), pUserData_, pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "VkDebugUtilsMessengerCreateInfoEXT" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DebugUtilsMessengerCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugUtilsMessengerCreateFlagsEXT flags_,
                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageSeverityFlagsEXT messageSeverity_,
                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageTypeFlagsEXT     messageType_,
                                      PFN_vkDebugUtilsMessengerCallbackEXT                    pfnUserCallback_,
                                      void *                                                  pUserData_       = {},
                                      const void *                                            pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT
      : DebugUtilsMessengerCreateInfoEXT( flags_, messageSeverity_, messageType_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugUtilsMessengerCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "VkDeviceDeviceMemoryReportCreateInfoEXT" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DeviceDeviceMemoryReportCreateInfoEXT( VULKAN_HPP_NAMESPACE::DeviceMemoryReportFlagsEXT flags_,
                                           PFN_vkDeviceMemoryReportCallbackEXT              pfnUserCallback_,
                                           void *                                           pUserData_       = {},
                                           const void *                                     pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT
      : DeviceDeviceMemoryReportCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DeviceMemoryReportCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "DirectDriverLoadingInfoLUNARG" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DirectDriverLoadingInfoLUNARG( VULKAN_HPP_NAMESPACE::DirectDriverLoadingFlagsLUNARG flags_,
                                   PFN_vkGetInstanceProcAddrLUNARG                      pfnGetInstanceProcAddr_,
                                   void *                                               pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT
      : DirectDriverLoadingInfoLUNARG( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_GetInstanceProcAddrLUNARG>( pfnGetInstanceProcAddr_ ), pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  return str;
}